

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.hpp
# Opt level: O2

void __thiscall csv::CSVReader::initial_read(CSVReader *this)

{
  CSVReader *local_30;
  thread local_28;
  code *local_20;
  undefined8 local_18;
  
  local_20 = read_csv;
  local_18 = 0;
  local_30 = this;
  std::thread::
  thread<bool(csv::CSVReader::*)(unsigned_long),csv::CSVReader*,unsigned_long_const&,void>
            (&local_28,(type *)&local_20,&local_30,&internals::ITERATION_CHUNK_SIZE);
  std::thread::operator=(&this->read_csv_worker,&local_28);
  std::thread::~thread(&local_28);
  std::thread::join();
  return;
}

Assistant:

void initial_read() {
            this->read_csv_worker = std::thread(&CSVReader::read_csv, this, internals::ITERATION_CHUNK_SIZE);
            this->read_csv_worker.join();
        }